

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int GetMaxLabelLength(void *hPtr)

{
  int iVar1;
  int32_t iVar2;
  element_type *this;
  ulong uVar3;
  exception *e;
  string label;
  int i;
  int maxLen;
  int numLabels;
  shared_ptr<const_fasttext::Dictionary> dict;
  FastTextWrapper *fastText;
  FastText *in_stack_ffffffffffffff38;
  string local_68 [36];
  int local_44;
  int local_40;
  int32_t in_stack_ffffffffffffffc4;
  Dictionary *in_stack_ffffffffffffffc8;
  
  fasttext::FastText::getDictionary(in_stack_ffffffffffffff38);
  this = std::
         __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1efc23);
  iVar2 = fasttext::Dictionary::nlabels(this);
  local_40 = 0;
  for (local_44 = 0; iVar1 = local_40, local_44 < iVar2; local_44 = local_44 + 1) {
    std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1efc73);
    fasttext::Dictionary::getLabel_abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    uVar3 = std::__cxx11::string::length();
    if ((ulong)(long)local_40 < uVar3) {
      local_40 = std::__cxx11::string::length();
    }
    std::__cxx11::string::~string(local_68);
  }
  std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
            ((shared_ptr<const_fasttext::Dictionary> *)0x1efe55);
  return iVar1;
}

Assistant:

GetMaxLabelLength(void* hPtr)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    int maxLen = 0;

    try {
        for (int i = 0; i < numLabels; ++i)
        {
            auto label = dict->getLabel(i);
            if (label.length() > maxLen)
            {
                maxLen = label.length();
            }
        }

        return maxLen;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}